

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyRigidBodyCollisionConfiguration.cpp
# Opt level: O3

void __thiscall
btSoftBodyRigidBodyCollisionConfiguration::~btSoftBodyRigidBodyCollisionConfiguration
          (btSoftBodyRigidBodyCollisionConfiguration *this)

{
  (this->super_btDefaultCollisionConfiguration).super_btCollisionConfiguration.
  _vptr_btCollisionConfiguration =
       (_func_int **)&PTR__btSoftBodyRigidBodyCollisionConfiguration_00221948;
  (**this->m_softSoftCreateFunc->_vptr_btCollisionAlgorithmCreateFunc)();
  btAlignedFreeInternal(this->m_softSoftCreateFunc);
  (**this->m_softRigidConvexCreateFunc->_vptr_btCollisionAlgorithmCreateFunc)();
  btAlignedFreeInternal(this->m_softRigidConvexCreateFunc);
  (**this->m_swappedSoftRigidConvexCreateFunc->_vptr_btCollisionAlgorithmCreateFunc)();
  btAlignedFreeInternal(this->m_swappedSoftRigidConvexCreateFunc);
  (**this->m_softRigidConcaveCreateFunc->_vptr_btCollisionAlgorithmCreateFunc)();
  btAlignedFreeInternal(this->m_softRigidConcaveCreateFunc);
  (**this->m_swappedSoftRigidConcaveCreateFunc->_vptr_btCollisionAlgorithmCreateFunc)();
  btAlignedFreeInternal(this->m_swappedSoftRigidConcaveCreateFunc);
  btDefaultCollisionConfiguration::~btDefaultCollisionConfiguration
            (&this->super_btDefaultCollisionConfiguration);
  return;
}

Assistant:

btSoftBodyRigidBodyCollisionConfiguration::~btSoftBodyRigidBodyCollisionConfiguration()
{
	m_softSoftCreateFunc->~btCollisionAlgorithmCreateFunc();
	btAlignedFree(	m_softSoftCreateFunc);

	m_softRigidConvexCreateFunc->~btCollisionAlgorithmCreateFunc();
	btAlignedFree(	m_softRigidConvexCreateFunc);

	m_swappedSoftRigidConvexCreateFunc->~btCollisionAlgorithmCreateFunc();
	btAlignedFree(	m_swappedSoftRigidConvexCreateFunc);

#ifdef ENABLE_SOFTBODY_CONCAVE_COLLISIONS
	m_softRigidConcaveCreateFunc->~btCollisionAlgorithmCreateFunc();
	btAlignedFree(	m_softRigidConcaveCreateFunc);

	m_swappedSoftRigidConcaveCreateFunc->~btCollisionAlgorithmCreateFunc();
	btAlignedFree(	m_swappedSoftRigidConcaveCreateFunc);
#endif
}